

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_context.c
# Opt level: O1

GLFWbool chooseGLXFBConfig(_GLFWfbconfig *desired,GLXFBConfig *result)

{
  GLXFBConfig p_Var1;
  int iVar2;
  GLFWbool GVar3;
  char *__s1;
  GLXFBConfig *pp_Var4;
  XVisualInfo_conflict *pXVar5;
  _GLFWfbconfig *p_Var6;
  long lVar7;
  uint uVar8;
  int value;
  int nativeCount;
  uint local_64;
  bool local_5d;
  int local_5c;
  _GLFWfbconfig *local_58;
  uint local_4c;
  _GLFWfbconfig *local_48;
  GLXFBConfig *local_40;
  GLXFBConfig *local_38;
  
  local_48 = desired;
  __s1 = (*_glfw.glx.GetClientString)(_glfw.x11.display,1);
  if (__s1 == (char *)0x0) {
    local_5d = true;
  }
  else {
    iVar2 = strcmp(__s1,"Chromium");
    local_5d = iVar2 != 0;
  }
  pp_Var4 = (*_glfw.glx.GetFBConfigs)(_glfw.x11.display,_glfw.x11.screen,&local_5c);
  if (pp_Var4 == (GLXFBConfig *)0x0 || local_5c == 0) {
    uVar8 = 0;
    _glfwInputError(0x10006,"GLX: No GLXFBConfigs returned");
  }
  else {
    local_40 = result;
    local_58 = (_GLFWfbconfig *)calloc((long)local_5c,0x48);
    if (local_5c < 1) {
      uVar8 = 0;
    }
    else {
      lVar7 = 0;
      uVar8 = 0;
      local_38 = pp_Var4;
      do {
        p_Var1 = pp_Var4[lVar7];
        (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,0x8011,(int *)&local_64);
        if (((local_64 & 1) != 0) &&
           ((*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,0x8010,(int *)&local_64),
           (local_5d & (local_64 & 1) == 0) == 0)) {
          p_Var6 = local_58 + (int)uVar8;
          local_4c = uVar8;
          if ((local_48->transparent != 0) &&
             (pXVar5 = (*_glfw.glx.GetVisualFromFBConfig)(_glfw.x11.display,p_Var1),
             pXVar5 != (XVisualInfo_conflict *)0x0)) {
            GVar3 = _glfwIsVisualTransparentX11(pXVar5->visual);
            p_Var6->transparent = GVar3;
            XFree(pXVar5);
          }
          (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,8,(int *)&local_64);
          p_Var6->redBits = local_64;
          (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,9,(int *)&local_64);
          p_Var6->greenBits = local_64;
          (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,10,(int *)&local_64);
          p_Var6->blueBits = local_64;
          (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,0xb,(int *)&local_64);
          p_Var6->alphaBits = local_64;
          (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,0xc,(int *)&local_64);
          p_Var6->depthBits = local_64;
          (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,0xd,(int *)&local_64);
          p_Var6->stencilBits = local_64;
          (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,0xe,(int *)&local_64);
          p_Var6->accumRedBits = local_64;
          (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,0xf,(int *)&local_64);
          p_Var6->accumGreenBits = local_64;
          (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,0x10,(int *)&local_64);
          p_Var6->accumBlueBits = local_64;
          (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,0x11,(int *)&local_64);
          p_Var6->accumAlphaBits = local_64;
          (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,7,(int *)&local_64);
          p_Var6->auxBuffers = local_64;
          (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,6,(int *)&local_64);
          if (local_64 != 0) {
            p_Var6->stereo = 1;
          }
          (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,5,(int *)&local_64);
          uVar8 = local_4c;
          if (local_64 != 0) {
            p_Var6->doublebuffer = 1;
          }
          if (_glfw.glx.ARB_multisample != 0) {
            (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,0x186a1,(int *)&local_64);
            p_Var6->samples = local_64;
          }
          if (_glfw.glx.EXT_framebuffer_sRGB != 0 || _glfw.glx.ARB_framebuffer_sRGB != 0) {
            (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,0x20b2,(int *)&local_64);
            p_Var6->sRGB = local_64;
          }
          p_Var6->handle = (uintptr_t)p_Var1;
          uVar8 = uVar8 + 1;
          pp_Var4 = local_38;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < local_5c);
    }
    p_Var6 = _glfwChooseFBConfig(local_48,local_58,uVar8);
    if (p_Var6 != (_GLFWfbconfig *)0x0) {
      *local_40 = (GLXFBConfig)p_Var6->handle;
    }
    uVar8 = (uint)(p_Var6 != (_GLFWfbconfig *)0x0);
    XFree(pp_Var4);
    free(local_58);
  }
  return uVar8;
}

Assistant:

static GLFWbool chooseGLXFBConfig(const _GLFWfbconfig* desired,
                                  GLXFBConfig* result)
{
    GLXFBConfig* nativeConfigs;
    _GLFWfbconfig* usableConfigs;
    const _GLFWfbconfig* closest;
    int i, nativeCount, usableCount;
    const char* vendor;
    GLFWbool trustWindowBit = GLFW_TRUE;

    // HACK: This is a (hopefully temporary) workaround for Chromium
    //       (VirtualBox GL) not setting the window bit on any GLXFBConfigs
    vendor = glXGetClientString(_glfw.x11.display, GLX_VENDOR);
    if (vendor && strcmp(vendor, "Chromium") == 0)
        trustWindowBit = GLFW_FALSE;

    nativeConfigs =
        glXGetFBConfigs(_glfw.x11.display, _glfw.x11.screen, &nativeCount);
    if (!nativeConfigs || !nativeCount)
    {
        _glfwInputError(GLFW_API_UNAVAILABLE, "GLX: No GLXFBConfigs returned");
        return GLFW_FALSE;
    }

    usableConfigs = calloc(nativeCount, sizeof(_GLFWfbconfig));
    usableCount = 0;

    for (i = 0;  i < nativeCount;  i++)
    {
        const GLXFBConfig n = nativeConfigs[i];
        _GLFWfbconfig* u = usableConfigs + usableCount;

        // Only consider RGBA GLXFBConfigs
        if (!(getGLXFBConfigAttrib(n, GLX_RENDER_TYPE) & GLX_RGBA_BIT))
            continue;

        // Only consider window GLXFBConfigs
        if (!(getGLXFBConfigAttrib(n, GLX_DRAWABLE_TYPE) & GLX_WINDOW_BIT))
        {
            if (trustWindowBit)
                continue;
        }

        if (desired->transparent)
        {
            XVisualInfo* vi = glXGetVisualFromFBConfig(_glfw.x11.display, n);
            if (vi)
            {
                u->transparent = _glfwIsVisualTransparentX11(vi->visual);
                XFree(vi);
            }
        }

        u->redBits = getGLXFBConfigAttrib(n, GLX_RED_SIZE);
        u->greenBits = getGLXFBConfigAttrib(n, GLX_GREEN_SIZE);
        u->blueBits = getGLXFBConfigAttrib(n, GLX_BLUE_SIZE);

        u->alphaBits = getGLXFBConfigAttrib(n, GLX_ALPHA_SIZE);
        u->depthBits = getGLXFBConfigAttrib(n, GLX_DEPTH_SIZE);
        u->stencilBits = getGLXFBConfigAttrib(n, GLX_STENCIL_SIZE);

        u->accumRedBits = getGLXFBConfigAttrib(n, GLX_ACCUM_RED_SIZE);
        u->accumGreenBits = getGLXFBConfigAttrib(n, GLX_ACCUM_GREEN_SIZE);
        u->accumBlueBits = getGLXFBConfigAttrib(n, GLX_ACCUM_BLUE_SIZE);
        u->accumAlphaBits = getGLXFBConfigAttrib(n, GLX_ACCUM_ALPHA_SIZE);

        u->auxBuffers = getGLXFBConfigAttrib(n, GLX_AUX_BUFFERS);

        if (getGLXFBConfigAttrib(n, GLX_STEREO))
            u->stereo = GLFW_TRUE;
        if (getGLXFBConfigAttrib(n, GLX_DOUBLEBUFFER))
            u->doublebuffer = GLFW_TRUE;

        if (_glfw.glx.ARB_multisample)
            u->samples = getGLXFBConfigAttrib(n, GLX_SAMPLES);

        if (_glfw.glx.ARB_framebuffer_sRGB || _glfw.glx.EXT_framebuffer_sRGB)
            u->sRGB = getGLXFBConfigAttrib(n, GLX_FRAMEBUFFER_SRGB_CAPABLE_ARB);

        u->handle = (uintptr_t) n;
        usableCount++;
    }

    closest = _glfwChooseFBConfig(desired, usableConfigs, usableCount);
    if (closest)
        *result = (GLXFBConfig) closest->handle;

    XFree(nativeConfigs);
    free(usableConfigs);

    return closest != NULL;
}